

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_condition(Context_conflict2 *ctx,uint32 *controls)

{
  int iVar1;
  ulong local_28;
  size_t i;
  uint32 *controls_local;
  Context_conflict2 *ctx_local;
  
  if (2 < ctx->tokenlen) {
    for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
      iVar1 = check_token_segment(ctx,parse_condition::comps[local_28]);
      if (iVar1 != 0) {
        *controls = (int)local_28 + 1;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int parse_condition(Context *ctx, uint32 *controls)
{
    static const char *comps[] = { "_gt", "_eq", "_ge", "_lt", "_ne", "_le" };
    size_t i;

    if (ctx->tokenlen >= 3)
    {
        for (i = 0; i < STATICARRAYLEN(comps); i++)
        {
            if (check_token_segment(ctx, comps[i]))
            {
                *controls = (uint32) (i + 1);
                return 1;
            } // if
        } // for
    } // if

    return 0;
}